

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

int __thiscall google::protobuf::internal::SooRep::size(SooRep *this,bool is_soo)

{
  ulong uVar1;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) != is_soo) {
    size();
  }
  if (!is_soo) {
    return (this->field_0).long_rep.size;
  }
  return (uint)uVar1 & 3;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }